

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_test.cpp
# Opt level: O3

void flatbuffers::tests::AlignmentTest(void)

{
  uint uVar1;
  bool bVar2;
  Offset<OuterLarge> off;
  Offset<flatbuffers::Vector<const_BadAlignmentSmall_*,_unsigned_int>_> off_00;
  uoffset_t uVar3;
  Offset<flatbuffers::Vector<const_EvenSmallStruct_*,_unsigned_int>_> off_01;
  Offset<flatbuffers::Vector<const_OddSmallStruct_*,_unsigned_int>_> off_02;
  uint *puVar4;
  ulong uVar5;
  uint8_t *puVar6;
  long lVar7;
  ulong uVar8;
  char *__function;
  ulong uVar9;
  EvenSmallStruct *v;
  OddSmallStruct *v_00;
  int *piVar10;
  initializer_list<EvenSmallStruct> __l;
  initializer_list<OddSmallStruct> __l_00;
  vector<EvenSmallStruct,_std::allocator<EvenSmallStruct>_> even_vector;
  vector<OddSmallStruct,_std::allocator<OddSmallStruct>_> odd_vector;
  FlatBufferBuilder builder;
  Verifier verifier_small_structs;
  Verifier verifier;
  BadAlignmentSmall *small;
  BadAlignmentLarge large;
  allocator_type local_181;
  vector<EvenSmallStruct,_std::allocator<EvenSmallStruct>_> local_180;
  vector<OddSmallStruct,_std::allocator<OddSmallStruct>_> local_168;
  FlatBufferBuilderImpl<false> local_150;
  VerifierTemplate<false> local_d0;
  VerifierTemplate<false> local_88;
  uint8_t *local_40;
  BadAlignmentLarge local_38;
  
  local_150.buf_.allocator_ = (Allocator *)0x0;
  local_150.buf_.own_allocator_ = false;
  local_150.buf_.initial_size_ = 0x400;
  local_150.buf_.max_size_ = 0x7fffffff;
  local_150.buf_.buffer_minalign_ = 8;
  local_150.buf_.reserved_ = 0;
  local_150.buf_.size_ = 0;
  local_150.length_of_64_bit_region_ = 0;
  local_150.nested = false;
  local_150.finished = false;
  local_150.buf_.buf_ = (uint8_t *)0x0;
  local_150.buf_.cur_._0_6_ = 0;
  local_150.buf_.cur_._6_2_ = 0;
  local_150.buf_.scratch_._0_6_ = 0;
  local_150.buf_.scratch_._6_2_ = 0;
  local_150.num_field_loc = 0;
  local_150.max_voffset_ = 0;
  local_150.minalign_ = 1;
  local_150.force_defaults_ = false;
  local_150.dedup_vtables_ = true;
  local_150.string_pool = (StringOffsetMap *)0x0;
  local_38.var_0_ = 0;
  FlatBufferBuilderImpl<false>::NotNested(&local_150);
  uVar1 = local_150.buf_.size_;
  local_150.nested = true;
  FlatBufferBuilderImpl<false>::AddStruct<BadAlignmentLarge>(&local_150,4,&local_38);
  off.o = FlatBufferBuilderImpl<false>::EndTable(&local_150,uVar1);
  off_00.o = FlatBufferBuilderImpl<false>::CreateUninitializedVector(&local_150,9,0xc,4,&local_40);
  FlatBufferBuilderImpl<false>::NotNested(&local_150);
  uVar1 = local_150.buf_.size_;
  local_150.nested = true;
  FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<BadAlignmentSmall_const*,unsigned_int>>(&local_150,6,off_00);
  FlatBufferBuilderImpl<false>::AddOffset<OuterLarge>(&local_150,4,off);
  uVar3 = FlatBufferBuilderImpl<false>::EndTable(&local_150,uVar1);
  FlatBufferBuilderImpl<false>::Finish(&local_150,uVar3,(char *)0x0,false);
  local_88.buf_ = FlatBufferBuilderImpl<false>::GetBufferPointer(&local_150);
  local_88.size_ = (size_t)local_150.buf_.size_;
  local_88.opts_.max_depth = 0x40;
  local_88.opts_.max_tables = 1000000;
  local_88.opts_.check_alignment = true;
  local_88.opts_.check_nested_flatbuffers = true;
  local_88.opts_.max_size = 0x7fffffff;
  local_88.opts_.assert = false;
  local_88.upper_bound_ = 0;
  local_88.depth_ = 0;
  local_88.num_tables_ = 0;
  local_88.flex_reuse_tracker_ = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  if (local_88.size_ < 0x7fffffff) {
    bVar2 = VerifierTemplate<false>::VerifyBufferFromStart<BadAlignmentRoot>
                      (&local_88,(char *)0x0,0);
    TestEq<bool,bool>(true,bVar2,"\'true\' != \'verifier.VerifyBuffer<BadAlignmentRoot>(nullptr)\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/alignment_test.cpp"
                      ,0x1c,"");
    local_150.num_field_loc = 0;
    local_150.max_voffset_ = 0;
    if (local_150.buf_.buf_ == (uint8_t *)0x0) {
      local_150.buf_.reserved_ = 0;
      puVar6 = (uint8_t *)0x0;
    }
    else {
      puVar6 = local_150.buf_.buf_ + local_150.buf_.reserved_;
    }
    local_150.buf_.cur_._0_6_ = SUB86(puVar6,0);
    local_150.buf_.cur_._6_2_ = (undefined2)((ulong)puVar6 >> 0x30);
    local_150.buf_.size_ = 0;
    local_150.buf_.scratch_._0_6_ = SUB86(local_150.buf_.buf_,0);
    local_150.buf_.scratch_._6_2_ = (undefined2)((ulong)local_150.buf_.buf_ >> 0x30);
    local_150.nested = false;
    local_150.finished = false;
    local_150.minalign_ = 1;
    local_150.length_of_64_bit_region_ = 0;
    if (&(local_150.string_pool)->_M_t !=
        (_Rb_tree<flatbuffers::Offset<flatbuffers::String>,_flatbuffers::Offset<flatbuffers::String>,_std::_Identity<flatbuffers::Offset<flatbuffers::String>_>,_flatbuffers::FlatBufferBuilderImpl<false>::StringOffsetCompare,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
         *)0x0) {
      std::
      _Rb_tree<flatbuffers::Offset<flatbuffers::String>,_flatbuffers::Offset<flatbuffers::String>,_std::_Identity<flatbuffers::Offset<flatbuffers::String>_>,_flatbuffers::FlatBufferBuilderImpl<false>::StringOffsetCompare,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
      ::clear(&(local_150.string_pool)->_M_t);
    }
    local_d0.buf_ = (uint8_t *)CONCAT26(local_d0.buf_._6_2_,0x10401030102);
    __l._M_len = 3;
    __l._M_array = (iterator)&local_d0;
    std::vector<EvenSmallStruct,_std::allocator<EvenSmallStruct>_>::vector
              (&local_180,__l,(allocator_type *)&local_168);
    local_d0.buf_ = (uint8_t *)0x201070809040506;
    local_d0.size_ = CONCAT71(local_d0.size_._1_7_,3);
    __l_00._M_len = 3;
    __l_00._M_array = (iterator)&local_d0;
    std::vector<OddSmallStruct,_std::allocator<OddSmallStruct>_>::vector
              (&local_168,__l_00,&local_181);
    v = (EvenSmallStruct *)
        &data<EvenSmallStruct,std::allocator<EvenSmallStruct>>(std::vector<EvenSmallStruct,std::allocator<EvenSmallStruct>>const&)
         ::t;
    if ((long)local_180.super__Vector_base<EvenSmallStruct,_std::allocator<EvenSmallStruct>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_180.super__Vector_base<EvenSmallStruct,_std::allocator<EvenSmallStruct>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      v = local_180.super__Vector_base<EvenSmallStruct,_std::allocator<EvenSmallStruct>_>._M_impl.
          super__Vector_impl_data._M_start;
    }
    off_01 = FlatBufferBuilderImpl<false>::
             CreateVectorOfStructs<EvenSmallStruct,_flatbuffers::Offset,_flatbuffers::Vector>
                       (&local_150,v,
                        (long)local_180.
                              super__Vector_base<EvenSmallStruct,_std::allocator<EvenSmallStruct>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_180.
                              super__Vector_base<EvenSmallStruct,_std::allocator<EvenSmallStruct>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 1);
    v_00 = (OddSmallStruct *)
           &data<OddSmallStruct,std::allocator<OddSmallStruct>>(std::vector<OddSmallStruct,std::allocator<OddSmallStruct>>const&)
            ::t;
    if ((long)local_168.super__Vector_base<OddSmallStruct,_std::allocator<OddSmallStruct>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_168.super__Vector_base<OddSmallStruct,_std::allocator<OddSmallStruct>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      v_00 = local_168.super__Vector_base<OddSmallStruct,_std::allocator<OddSmallStruct>_>._M_impl.
             super__Vector_impl_data._M_start;
    }
    off_02 = FlatBufferBuilderImpl<false>::
             CreateVectorOfStructs<OddSmallStruct,_flatbuffers::Offset,_flatbuffers::Vector>
                       (&local_150,v_00,
                        ((long)local_168.
                               super__Vector_base<OddSmallStruct,_std::allocator<OddSmallStruct>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_168.
                              super__Vector_base<OddSmallStruct,_std::allocator<OddSmallStruct>_>.
                              _M_impl.super__Vector_impl_data._M_start) * -0x5555555555555555);
    FlatBufferBuilderImpl<false>::NotNested(&local_150);
    uVar1 = local_150.buf_.size_;
    local_150.nested = true;
    FlatBufferBuilderImpl<false>::AddOffset<flatbuffers::Vector<OddSmallStruct_const*,unsigned_int>>
              (&local_150,6,off_02);
    FlatBufferBuilderImpl<false>::
    AddOffset<flatbuffers::Vector<EvenSmallStruct_const*,unsigned_int>>(&local_150,4,off_01);
    uVar3 = FlatBufferBuilderImpl<false>::EndTable(&local_150,uVar1);
    FlatBufferBuilderImpl<false>::Finish(&local_150,uVar3,(char *)0x0,false);
    local_d0.buf_ = FlatBufferBuilderImpl<false>::GetBufferPointer(&local_150);
    local_d0.size_ = (size_t)local_150.buf_.size_;
    local_d0.opts_.max_depth = 0x40;
    local_d0.opts_.max_tables = 1000000;
    local_d0.opts_.check_alignment = true;
    local_d0.opts_.check_nested_flatbuffers = true;
    local_d0.opts_.max_size = 0x7fffffff;
    local_d0.opts_.assert = false;
    local_d0.upper_bound_ = 0;
    local_d0.depth_ = 0;
    local_d0.num_tables_ = 0;
    local_d0.flex_reuse_tracker_ = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
    if (local_d0.size_ < 0x7fffffff) {
      bVar2 = VerifierTemplate<false>::VerifyBufferFromStart<SmallStructs>(&local_d0,(char *)0x0,0);
      TestEq<bool,bool>(true,bVar2,
                        "\'true\' != \'verifier_small_structs.VerifyBuffer<SmallStructs>(nullptr)\'"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/alignment_test.cpp"
                        ,0x3e,"");
      puVar4 = (uint *)FlatBufferBuilderImpl<false>::GetBufferPointer(&local_150);
      if (puVar4 == (uint *)0x0) {
        piVar10 = (int *)0x0;
      }
      else {
        piVar10 = (int *)((ulong)*puVar4 + (long)puVar4);
      }
      uVar5 = (ulong)*(ushort *)((long)piVar10 + (4 - (long)*piVar10));
      TestEq<unsigned_int,unsigned_long>
                (*(uint *)((long)piVar10 + *(uint *)((long)piVar10 + uVar5) + uVar5),
                 (long)local_180.
                       super__Vector_base<EvenSmallStruct,_std::allocator<EvenSmallStruct>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                 (long)local_180.
                       super__Vector_base<EvenSmallStruct,_std::allocator<EvenSmallStruct>_>._M_impl
                       .super__Vector_impl_data._M_start >> 1,
                 "\'root_msg->even_structs()->size()\' != \'even_vector.size()\'",
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/alignment_test.cpp"
                 ,0x44,"");
      lVar7 = (long)*piVar10;
      uVar5 = (ulong)*(ushort *)((long)piVar10 + (4 - lVar7));
      uVar8 = (ulong)*(uint *)((long)piVar10 + uVar5);
      if (*(int *)((long)piVar10 + uVar8 + uVar5) != 0) {
        uVar9 = 0;
        do {
          if (*(uint *)((long)piVar10 + uVar8 + uVar5) <= uVar9) {
LAB_001a87c7:
            __function = 
            "return_type flatbuffers::Vector<const EvenSmallStruct *>::Get(SizeT) const [T = const EvenSmallStruct *, SizeT = unsigned int]"
            ;
            goto LAB_001a87f3;
          }
          TestEq<unsigned_char,unsigned_char>
                    (local_180.super__Vector_base<EvenSmallStruct,_std::allocator<EvenSmallStruct>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar9].var_0_,
                     *(uchar *)((long)piVar10 + uVar9 * 2 + uVar5 + uVar8 + 4),
                     "\'even_vector[i].var_0()\' != \'root_msg->even_structs()->Get(i)->var_0()\'",
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/alignment_test.cpp"
                     ,0x47,"");
          if ((*(ushort *)((long)piVar10 - (long)*piVar10) < 5) ||
             (uVar5 = (ulong)*(ushort *)((long)piVar10 + (4 - (long)*piVar10)), uVar5 == 0)) {
            puVar4 = (uint *)0x0;
          }
          else {
            puVar4 = (uint *)((long)piVar10 + *(uint *)((long)piVar10 + uVar5) + uVar5);
          }
          if (*puVar4 <= uVar9) goto LAB_001a87c7;
          TestEq<unsigned_char,unsigned_char>
                    (local_180.super__Vector_base<EvenSmallStruct,_std::allocator<EvenSmallStruct>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar9].var_1_,
                     *(uchar *)((long)puVar4 + uVar9 * 2 + 5),
                     "\'even_vector[i].var_1()\' != \'root_msg->even_structs()->Get(i)->var_1()\'",
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/alignment_test.cpp"
                     ,0x48,"");
          uVar9 = uVar9 + 1;
          lVar7 = (long)*piVar10;
          uVar5 = (ulong)*(ushort *)((long)piVar10 + (4 - lVar7));
          uVar8 = (ulong)*(uint *)((long)piVar10 + uVar5);
        } while (uVar9 < *(uint *)((long)piVar10 + uVar8 + uVar5));
      }
      uVar5 = (ulong)*(ushort *)((long)piVar10 + (6 - lVar7));
      TestEq<unsigned_int,unsigned_long>
                (*(uint *)((long)piVar10 + *(uint *)((long)piVar10 + uVar5) + uVar5),
                 (long)local_180.
                       super__Vector_base<EvenSmallStruct,_std::allocator<EvenSmallStruct>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                 (long)local_180.
                       super__Vector_base<EvenSmallStruct,_std::allocator<EvenSmallStruct>_>._M_impl
                       .super__Vector_impl_data._M_start >> 1,
                 "\'root_msg->odd_structs()->size()\' != \'even_vector.size()\'",
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/alignment_test.cpp"
                 ,0x4b,"");
      uVar5 = (ulong)*(ushort *)((long)piVar10 + (6 - (long)*piVar10));
      uVar8 = (ulong)*(uint *)((long)piVar10 + uVar5);
      if (*(int *)((long)piVar10 + uVar8 + uVar5) != 0) {
        lVar7 = 0;
        uVar9 = 0;
        do {
          if (*(uint *)((long)piVar10 + uVar8 + uVar5) <= uVar9) {
LAB_001a87de:
            __function = 
            "return_type flatbuffers::Vector<const OddSmallStruct *>::Get(SizeT) const [T = const OddSmallStruct *, SizeT = unsigned int]"
            ;
LAB_001a87f3:
            __assert_fail("i < size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/vector.h"
                          ,0xc1,__function);
          }
          TestEq<unsigned_char,unsigned_char>
                    ((&(local_168.
                        super__Vector_base<OddSmallStruct,_std::allocator<OddSmallStruct>_>._M_impl.
                        super__Vector_impl_data._M_start)->var_0_)[lVar7],
                     *(uchar *)((long)piVar10 + lVar7 + 4 + uVar5 + uVar8),
                     "\'odd_vector[i].var_0()\' != \'root_msg->odd_structs()->Get(i)->var_0()\'",
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/alignment_test.cpp"
                     ,0x4d,"");
          if ((*(ushort *)((long)piVar10 - (long)*piVar10) < 7) ||
             (uVar5 = (ulong)*(ushort *)((long)piVar10 + (6 - (long)*piVar10)), uVar5 == 0)) {
            puVar4 = (uint *)0x0;
          }
          else {
            puVar4 = (uint *)((long)piVar10 + *(uint *)((long)piVar10 + uVar5) + uVar5);
          }
          if (*puVar4 <= uVar9) goto LAB_001a87de;
          TestEq<unsigned_char,unsigned_char>
                    ((&(local_168.
                        super__Vector_base<OddSmallStruct,_std::allocator<OddSmallStruct>_>._M_impl.
                        super__Vector_impl_data._M_start)->var_1_)[lVar7],
                     *(uchar *)((long)puVar4 + lVar7 + 5),
                     "\'odd_vector[i].var_1()\' != \'root_msg->odd_structs()->Get(i)->var_1()\'",
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/alignment_test.cpp"
                     ,0x4e,"");
          uVar9 = uVar9 + 1;
          uVar5 = (ulong)*(ushort *)((long)piVar10 + (6 - (long)*piVar10));
          uVar8 = (ulong)*(uint *)((long)piVar10 + uVar5);
          lVar7 = lVar7 + 3;
        } while (uVar9 < *(uint *)((long)piVar10 + uVar8 + uVar5));
      }
      if (local_168.super__Vector_base<OddSmallStruct,_std::allocator<OddSmallStruct>_>._M_impl.
          super__Vector_impl_data._M_start != (OddSmallStruct *)0x0) {
        operator_delete(local_168.
                        super__Vector_base<OddSmallStruct,_std::allocator<OddSmallStruct>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_168.
                              super__Vector_base<OddSmallStruct,_std::allocator<OddSmallStruct>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_168.
                              super__Vector_base<OddSmallStruct,_std::allocator<OddSmallStruct>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_180.super__Vector_base<EvenSmallStruct,_std::allocator<EvenSmallStruct>_>._M_impl.
          super__Vector_impl_data._M_start != (EvenSmallStruct *)0x0) {
        operator_delete(local_180.
                        super__Vector_base<EvenSmallStruct,_std::allocator<EvenSmallStruct>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_180.
                              super__Vector_base<EvenSmallStruct,_std::allocator<EvenSmallStruct>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_180.
                              super__Vector_base<EvenSmallStruct,_std::allocator<EvenSmallStruct>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&local_150);
      return;
    }
  }
  __assert_fail("size_ < opts.max_size",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/verifier.h"
                ,0x2f,
                "flatbuffers::VerifierTemplate<false>::VerifierTemplate(const uint8_t *const, const size_t, const Options &) [TrackVerifierBufferSize = false]"
               );
}

Assistant:

void AlignmentTest() {
  FlatBufferBuilder builder;

  BadAlignmentLarge large;
  Offset<OuterLarge> outer_large = CreateOuterLarge(builder, &large);

  BadAlignmentSmall *small;
  Offset<Vector<const BadAlignmentSmall *>> small_offset =
      builder.CreateUninitializedVectorOfStructs(9, &small);
  (void)small;  // We do not have to write data to trigger the test failure

  Offset<BadAlignmentRoot> root =
      CreateBadAlignmentRoot(builder, outer_large, small_offset);

  builder.Finish(root);

  Verifier verifier(builder.GetBufferPointer(), builder.GetSize());
  TEST_ASSERT(verifier.VerifyBuffer<BadAlignmentRoot>(nullptr));


  // ============= Test Small Structs Vector misalignment ========

  builder.Clear();

  // creating 5 structs with 2 bytes each
  // 10 bytes in total for Vector data is needed
  std::vector<EvenSmallStruct> even_vector = { { 2, 1 }, { 3, 1 }, { 4, 1 } };
  std::vector<OddSmallStruct> odd_vector = { { 6, 5, 4 },
                                             { 9, 8, 7 },
                                             { 1, 2, 3 } };
  // CreateVectorOfStructs is used in the generated CreateSmallStructsDirect()
  // method, but we test it directly
  Offset<Vector<const EvenSmallStruct *>> even_structs_offset =
      builder.CreateVectorOfStructs<EvenSmallStruct>(even_vector);
  Offset<Vector<const OddSmallStruct *>> odd_structs_offset =
      builder.CreateVectorOfStructs<OddSmallStruct>(odd_vector);
  Offset<SmallStructs> small_structs_root =
      CreateSmallStructs(builder, even_structs_offset, odd_structs_offset);

  builder.Finish(small_structs_root);

  // Save the binary that we later can annotate with `flatc --annotate` command
  // NOTE: the conversion of the JSON data to --binary via `flatc --binary`
  //       command is not changed with that fix and was always producing the
  //       correct binary data.
  // SaveFile("alignment_test_{before,after}_fix.bin",
  //          reinterpret_cast<char *>(builder.GetBufferPointer()),
  //          builder.GetSize(), true);

  Verifier verifier_small_structs(builder.GetBufferPointer(),
                                  builder.GetSize());
  TEST_ASSERT(verifier_small_structs.VerifyBuffer<SmallStructs>(nullptr));

  // Reading SmallStructs vector values back and compare with original
  auto root_msg =
      flatbuffers::GetRoot<SmallStructs>(builder.GetBufferPointer());

  TEST_EQ(root_msg->even_structs()->size(), even_vector.size());
  for (flatbuffers::uoffset_t i = 0; i < root_msg->even_structs()->size();
       ++i) {
    TEST_EQ(even_vector[i].var_0(), root_msg->even_structs()->Get(i)->var_0());
    TEST_EQ(even_vector[i].var_1(), root_msg->even_structs()->Get(i)->var_1());
  }

  TEST_EQ(root_msg->odd_structs()->size(), even_vector.size());
  for (flatbuffers::uoffset_t i = 0; i < root_msg->odd_structs()->size(); ++i) {
    TEST_EQ(odd_vector[i].var_0(), root_msg->odd_structs()->Get(i)->var_0());
    TEST_EQ(odd_vector[i].var_1(), root_msg->odd_structs()->Get(i)->var_1());
  }
}